

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_model.c
# Opt level: O2

int32 nextline_str2words(FILE *fp,int32 *lineno,char **lineptr,char ***wordptr)

{
  int32 iVar1;
  char *line;
  char **ptr;
  size_t len;
  
  do {
    ckd_free(*lineptr);
    line = fread_line(fp,&len);
    *lineptr = line;
    if (line == (char *)0x0) {
      return -1;
    }
    *lineno = *lineno + 1;
  } while ((*line == '#') || (iVar1 = str2words(line,(char **)0x0,0), iVar1 == 0));
  if (*wordptr == (char **)0x0) {
    ptr = (char **)__ckd_calloc__((long)iVar1,8,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                                  ,0x55);
  }
  else {
    ptr = (char **)__ckd_realloc__(*wordptr,(long)iVar1 << 3,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                                   ,0x57);
  }
  *wordptr = ptr;
  iVar1 = str2words(*lineptr,ptr,iVar1);
  return iVar1;
}

Assistant:

static int32
nextline_str2words(FILE * fp, int32 * lineno,
                   char **lineptr, char ***wordptr)
{
    for (;;) {
        size_t len;
        int32 n;

        ckd_free(*lineptr);
        if ((*lineptr = fread_line(fp, &len)) == NULL)
            return -1;

        (*lineno)++;

        if ((*lineptr)[0] == FSG_MODEL_COMMENT_CHAR)
            continue;           /* Skip comment lines */

        n = str2words(*lineptr, NULL, 0);
        if (n == 0)
            continue;           /* Skip blank lines */

        /* Abuse of realloc(), but this doesn't have to be fast. */
        if (*wordptr == NULL)
            *wordptr = ckd_calloc(n, sizeof(**wordptr));
        else
            *wordptr = ckd_realloc(*wordptr, n * sizeof(**wordptr));
        return str2words(*lineptr, *wordptr, n);
    }
}